

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

error destructuring_bind(atom arg_name,atom val,int val_unspecified,atom env)

{
  uint *puVar1;
  int iVar2;
  anon_union_8_9_1d3277aa_for_value symbol;
  atom env_00;
  atom a;
  atom expr;
  atom env_01;
  atom arg_name_00;
  atom arg_name_01;
  atom b;
  atom env_02;
  atom val_00;
  atom val_01;
  atom value;
  atom value_00;
  error err_1;
  error err;
  int val_unspecified_local;
  atom val_local;
  atom arg_name_local;
  
  val_local._0_8_ = val.value;
  symbol = arg_name.value;
  val_local.value._0_4_ = arg_name.type;
  err = val.type;
  if (val_local.value._0_4_ == T_NIL) {
    if (err == ERROR_OK) {
      arg_name_local.value._4_4_ = 0;
    }
    else {
      arg_name_local.value._4_4_ = 3;
    }
  }
  else if (val_local.value._0_4_ == T_CONS) {
    a._4_4_ = 0;
    a.type = ((symbol.pair)->car).type;
    b._4_4_ = 0;
    b.type = sym_o.type;
    a.value.symbol = (symbol.fp)->_IO_read_ptr;
    b.value.number = sym_o.value.number;
    iVar2 = is(a,b);
    if (iVar2 == 0) {
      if (err == ERROR_SYNTAX) {
        arg_name_00._4_4_ = 0;
        arg_name_00.type = ((symbol.pair)->car).type;
        val_00._4_4_ = 0;
        val_00.type = *(uint *)val_local._0_8_;
        arg_name_00.value.symbol = (symbol.fp)->_IO_read_ptr;
        val_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(val_local._0_8_ + 8))->pair;
        arg_name_local.value._4_4_ = destructuring_bind(arg_name_00,val_00,0,env);
        if (arg_name_local.value._4_4_ == ERROR_OK) {
          arg_name_01._4_4_ = 0;
          arg_name_01.type = ((symbol.pair)->cdr).type;
          val_01._4_4_ = 0;
          val_01.type = *(uint *)(val_local._0_8_ + 0x10);
          arg_name_01.value.symbol = (symbol.fp)->_IO_read_base;
          val_01.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(val_local._0_8_ + 0x18))->pair;
          arg_name_local.value._4_4_ =
               destructuring_bind(arg_name_01,val_01,(uint)(*(int *)(val_local._0_8_ + 0x10) == 0),
                                  env);
        }
      }
      else {
        arg_name_local.value._4_4_ = 3;
      }
    }
    else if (((val_unspecified == 0) || (*(int *)((*symbol.jb)[0].__jmpbuf[3] + 0x10) == 0)) ||
            (puVar1 = *(uint **)((*symbol.jb)[0].__jmpbuf[3] + 0x18), expr._4_4_ = 0,
            expr.type = *puVar1, env_02._4_4_ = 0, env_02.type = env.type,
            expr.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar1 + 2))->pair,
            env_02.value.number = env.value.number,
            arg_name_local.value._4_4_ = eval_expr(expr,env_02,(atom *)&err),
            arg_name_local.value._4_4_ == ERROR_OK)) {
      env_01._4_4_ = 0;
      env_01.type = env.type;
      value_00._4_4_ = 0;
      value_00.type = err;
      env_01.value.number = env.value.number;
      value_00.value = (anon_union_8_9_1d3277aa_for_value)val_local._0_8_;
      arg_name_local.value._4_4_ =
           env_assign(env_01,*(char **)((*symbol.jb)[0].__jmpbuf[3] + 8),value_00);
    }
  }
  else if (val_local.value._0_4_ == T_SYM) {
    env_00._4_4_ = 0;
    env_00.type = env.type;
    value._4_4_ = 0;
    value.type = err;
    env_00.value.number = env.value.number;
    value.value = (char)val_local._0_8_;
    arg_name_local.value._4_4_ = env_assign(env_00,symbol.symbol,value);
  }
  else {
    arg_name_local.value._4_4_ = 3;
  }
  return arg_name_local.value._4_4_;
}

Assistant:

error destructuring_bind(atom arg_name, atom val, int val_unspecified, atom env) {
	switch (arg_name.type) {
	case T_SYM:
		return env_assign(env, arg_name.value.symbol, val);
	case T_CONS:
		if (is(car(arg_name), sym_o)) { /* (o ARG [DEFAULT]) */
			if (val_unspecified) { /* missing argument */
				if (!no(cdr(cdr(arg_name)))) {
					error err = eval_expr(car(cdr(cdr(arg_name))), env, &val);
					if (err) return err;
				}
			}
			return env_assign(env, car(cdr(arg_name)).value.symbol, val);
		}
		else {
			if (val.type != T_CONS) {
				return ERROR_ARGS;
			}
			error err = destructuring_bind(car(arg_name), car(val), 0, env);
			if (err) return err;
			return destructuring_bind(cdr(arg_name), cdr(val), no(cdr(val)), env);
		}
	case T_NIL:
		if (no(val))
			return ERROR_OK;
		else
			return ERROR_ARGS;
	default:
		return ERROR_ARGS;
	}
}